

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_merge.cpp
# Opt level: O0

void __thiscall BamTools::MergeTool::MergeTool(MergeTool *this)

{
  OptionGroup *group;
  OptionGroup *pOVar1;
  AbstractTool *in_RDI;
  OptionGroup *IO_Opts;
  string *in_stack_fffffffffffffb98;
  string *in_stack_fffffffffffffba0;
  allocator *paVar2;
  MergeSettings *in_stack_fffffffffffffbd0;
  string *in_stack_fffffffffffffbf0;
  bool *in_stack_fffffffffffffc70;
  string *in_stack_fffffffffffffc78;
  string *in_stack_fffffffffffffc80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc88;
  bool *in_stack_fffffffffffffc90;
  string *in_stack_fffffffffffffc98;
  string *in_stack_fffffffffffffca0;
  string *in_stack_fffffffffffffca8;
  string *in_stack_fffffffffffffcb0;
  OptionGroup *in_stack_fffffffffffffcc0;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [32];
  OptionGroup *local_98;
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [39];
  allocator local_39;
  string local_38 [56];
  
  AbstractTool::AbstractTool(in_RDI);
  in_RDI->_vptr_AbstractTool = (_func_int **)&PTR__MergeTool_0033f060;
  group = (OptionGroup *)operator_new(0x80);
  MergeSettings::MergeSettings(in_stack_fffffffffffffbd0);
  in_RDI[1]._vptr_AbstractTool = (_func_int **)group;
  in_RDI[2]._vptr_AbstractTool = (_func_int **)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"bamtools merge",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"merges multiple BAM files into one",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_88,
             "[-in <filename> -in <filename> ... | -list <filelist>] [-out <filename> | [-forceCompression]] [-region <REGION>]"
             ,&local_89);
  Options::SetProgramInfo(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,(string *)0x21dfbe);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Input & Output",&local_b9);
  pOVar1 = Options::CreateOptionGroup(in_stack_fffffffffffffbf0);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  local_98 = pOVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"-in",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"BAM filename",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"the input BAM file(s)",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"",&local_159);
  Options::AddValueOption<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
             in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffc88,in_stack_fffffffffffffcc0);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"-list",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"filename",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"the input BAM file list, one line per file",&local_1d1);
  paVar2 = &local_1f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"",paVar2);
  Options::AddValueOption<std::__cxx11::string>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
             in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             in_stack_fffffffffffffcc0);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"-out",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"BAM filename",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"the output BAM file",&local_271);
  paVar2 = &local_299;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"",paVar2);
  Options::AddValueOption<std::__cxx11::string>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
             in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             in_stack_fffffffffffffcc0);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"-forceCompression",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2e8,
             "if results are sent to stdout (like when piping to another tool), default behavior is to leave output uncompressed. Use this flag to override and force compression"
             ,&local_2e9);
  Options::AddOption(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                     group);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"-region",&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"REGION",(allocator *)&stack0xfffffffffffffcc7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffca0,"genomic region. See README for more details",
             (allocator *)&stack0xfffffffffffffc9f);
  paVar2 = (allocator *)&stack0xfffffffffffffc77;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffc78,"",paVar2);
  Options::AddValueOption<std::__cxx11::string>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
             in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             in_stack_fffffffffffffcc0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc77);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffca0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc9f);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffcc7);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  return;
}

Assistant:

MergeTool::MergeTool()
    : AbstractTool()
    , m_settings(new MergeSettings)
    , m_impl(0)
{
    // set program details
    Options::SetProgramInfo("bamtools merge", "merges multiple BAM files into one",
                            "[-in <filename> -in <filename> ... | -list <filelist>] [-out "
                            "<filename> | [-forceCompression]] [-region <REGION>]");

    // set up options
    OptionGroup* IO_Opts = Options::CreateOptionGroup("Input & Output");
    Options::AddValueOption("-in", "BAM filename", "the input BAM file(s)", "",
                            m_settings->HasInput, m_settings->InputFiles, IO_Opts);
    Options::AddValueOption("-list", "filename", "the input BAM file list, one line per file", "",
                            m_settings->HasInputFilelist, m_settings->InputFilelist, IO_Opts);
    Options::AddValueOption("-out", "BAM filename", "the output BAM file", "",
                            m_settings->HasOutput, m_settings->OutputFilename, IO_Opts);
    Options::AddOption("-forceCompression",
                       "if results are sent to stdout (like when piping to another tool), default "
                       "behavior is to leave output uncompressed. Use this flag to override and "
                       "force compression",
                       m_settings->IsForceCompression, IO_Opts);
    Options::AddValueOption("-region", "REGION", "genomic region. See README for more details", "",
                            m_settings->HasRegion, m_settings->Region, IO_Opts);
}